

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECPrivateKey.cpp
# Opt level: O1

bool __thiscall ECPrivateKey::deserialise(ECPrivateKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dD;
  ByteString dEC;
  ByteString local_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&local_68,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&local_68);
    if (sVar1 != 0) {
      (**(code **)(*(long *)this + 0x50))(this,&local_40);
      bVar2 = true;
      (**(code **)(*(long *)this + 0x48))(this,&local_68);
      goto LAB_0012fdaa;
    }
  }
  bVar2 = false;
LAB_0012fdaa:
  local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_68.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&local_40.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>
            );
  return bVar2;
}

Assistant:

bool ECPrivateKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dD = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dD.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setD(dD);

	return true;
}